

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError file2string(char **bufp,FILE *file)

{
  int iVar1;
  CURLcode CVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  undefined1 *mem;
  size_t sVar8;
  size_t len;
  dynbuf dyn;
  char buffer [4096];
  dynbuf local_1058;
  undefined1 local_1038 [4104];
  
  curlx_dyn_init(&local_1058,0x400000000);
  if (file != (FILE *)0x0) {
    do {
      sVar3 = fread(local_1038,1,0x1000,(FILE *)file);
      iVar1 = ferror((FILE *)file);
      if (iVar1 != 0) {
        curlx_dyn_free(&local_1058);
        *bufp = (char *)0x0;
        return PARAM_READ_ERROR;
      }
      if (sVar3 != 0) {
        mem = local_1038;
        do {
          sVar8 = 0;
          do {
            if (((byte)mem[sVar8] < 0xe) &&
               (len = sVar8, (0x2401U >> ((byte)mem[sVar8] & 0x1f) & 1) != 0)) break;
            sVar8 = sVar8 + 1;
            len = sVar3;
          } while (sVar3 != sVar8);
          CVar2 = curlx_dyn_addn(&local_1058,mem,len);
          if (CVar2 != CURLE_OK) {
            return PARAM_NO_MEM;
          }
          if (sVar3 == len) break;
          lVar4 = 0;
          lVar7 = sVar3 - len;
          lVar5 = lVar4;
          if (lVar7 != 0) {
            do {
              lVar5 = lVar4;
              if ((0xd < (byte)mem[lVar4 + len]) ||
                 ((0x2401U >> ((byte)mem[lVar4 + len] & 0x1f) & 1) == 0)) break;
              lVar4 = lVar4 + 1;
              lVar5 = lVar7;
            } while (lVar7 != lVar4);
          }
          mem = mem + lVar5 + len;
          sVar3 = lVar7 - lVar5;
        } while (sVar3 != 0);
      }
      iVar1 = feof((FILE *)file);
    } while (iVar1 == 0);
  }
  pcVar6 = curlx_dyn_ptr(&local_1058);
  *bufp = pcVar6;
  return PARAM_OK;
}

Assistant:

ParameterError file2string(char **bufp, FILE *file)
{
  struct curlx_dynbuf dyn;
  curlx_dyn_init(&dyn, MAX_FILE2STRING);
  if(file) {
    do {
      char buffer[4096];
      char *ptr;
      size_t nread = fread(buffer, 1, sizeof(buffer), file);
      if(ferror(file)) {
        curlx_dyn_free(&dyn);
        *bufp = NULL;
        return PARAM_READ_ERROR;
      }
      ptr = buffer;
      while(nread) {
        size_t nlen = memcrlf(ptr, FALSE, nread);
        if(curlx_dyn_addn(&dyn, ptr, nlen))
          return PARAM_NO_MEM;
        nread -= nlen;

        if(nread) {
          ptr += nlen;
          nlen = memcrlf(ptr, TRUE, nread);
          ptr += nlen;
          nread -= nlen;
        }
      }
    } while(!feof(file));
  }
  *bufp = curlx_dyn_ptr(&dyn);
  return PARAM_OK;
}